

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

int __thiscall
CVmObjByteArray::index_val_q
          (CVmObjByteArray *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  byte bVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  if (index_val->typ == VM_INT) {
    uVar3 = (index_val->val).obj;
  }
  else {
    uVar3 = vm_val_t::nonint_num_to_int(index_val);
  }
  if ((0 < (int)uVar3) && (puVar2 = (uint *)(this->super_CVmObject).ext_, uVar3 <= *puVar2)) {
    uVar4 = (uint)((ulong)uVar3 - 1);
    bVar1 = *(byte *)(*(long *)(*(long *)(puVar2 + ((ulong)uVar3 - 1 >> 0x1c) * 2 + 1) +
                               (ulong)(uVar4 >> 0xc & 0xfff8)) + (ulong)(uVar4 & 0x7fff));
    result->typ = VM_INT;
    *(uint *)&result->val = (uint)bVar1;
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjByteArray::index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                 const vm_val_t *index_val)
{
    /* get the index */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* make sure it's in range */
    if (idx < 1 || (uint32_t)idx > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    
    /* get a pointer to the desired element */
    size_t avail;
    unsigned char *p = get_ele_ptr(idx, &avail);

    /* return the value as an integer */
    result->set_int((int)(unsigned short)*p);

    /* handled */
    return TRUE;
}